

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O0

ostream * gerr::details::operator<<(ostream *os,IError *err)

{
  IError *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  bool local_71;
  Error *next;
  __cxx11 local_58 [39];
  bool local_31;
  char *pcStack_30;
  bool hasMsg;
  char *msg;
  IError *pIStack_20;
  int c;
  IError *p;
  IError *err_local;
  ostream *os_local;
  
  pIStack_20 = err;
  p = err;
  err_local = (IError *)os;
  while( true ) {
    msg._4_4_ = (*pIStack_20->_vptr_IError[2])();
    iVar3 = (*pIStack_20->_vptr_IError[3])();
    pIVar1 = err_local;
    pcStack_30 = (char *)CONCAT44(extraout_var,iVar3);
    local_71 = false;
    if (pcStack_30 != (char *)0x0) {
      local_71 = *pcStack_30 != '\0';
    }
    local_31 = local_71;
    if ((msg._4_4_ == 0) || (local_71 == false)) {
      if (msg._4_4_ == 0) {
        std::operator<<((ostream *)err_local,pcStack_30);
      }
      else {
        std::__cxx11::to_string(local_58,msg._4_4_);
        std::operator<<((ostream *)pIVar1,(string *)local_58);
        std::__cxx11::string::~string((string *)local_58);
      }
    }
    else {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)err_local,msg._4_4_);
      poVar4 = std::operator<<(poVar4,":");
      std::operator<<(poVar4,pcStack_30);
    }
    iVar3 = (*pIStack_20->_vptr_IError[4])();
    bVar2 = std::operator!=((shared_ptr<gerr::details::IError> *)CONCAT44(extraout_var_00,iVar3),
                            (nullptr_t)0x0);
    if (!bVar2) break;
    std::operator<<((ostream *)err_local,":");
    pIStack_20 = std::__shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT44(extraout_var_00,iVar3));
  }
  return (ostream *)err_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, IError const& err) {
    for (auto p = &err;;) {
      auto const c = p->Code();
      auto const msg = p->Message();
      auto const hasMsg = msg != nullptr && msg[0] != '\0';
      if (c != 0 && hasMsg) {
        // 同时持有非 0 的 code 和 message，同时打印
        os << c << ":" << msg;
      } else if (c == 0) {
        // 如果 code == 0，就只打印 message
        os << msg;
      } else {  // c != 0 && !hasMsg
        // 如果 message 是空，就只打印 code
        os << std::to_string(c);
      }
      auto const& next = p->Cause();
      if (next != nullptr) {
        os << ":";
        p = next.get();
      } else {
        break;
      }
    }
    return os;
  }